

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_creader_set_fread(Curl_easy *data,curl_off_t len)

{
  Curl_creader *pCVar1;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  Curl_creader *in_RAX;
  Curl_creader *r;
  Curl_creader *local_38;
  
  local_38 = in_RAX;
  CVar3 = Curl_creader_create(&local_38,data,&cr_in,CURL_CR_CLIENT);
  if (CVar3 == CURLE_OK) {
    *(curl_off_t *)((long)local_38->ctx + 0x30) = len;
    pCVar1 = (data->req).reader_stack;
    while (pCVar1 != (Curl_creader *)0x0) {
      (data->req).reader_stack = pCVar1->next;
      (*pCVar1->crt->do_close)(data,pCVar1);
      (*Curl_cfree)(pCVar1);
      pCVar1 = (data->req).reader_stack;
    }
    CVar3 = do_init_reader_stack(data,local_38);
  }
  else if (data == (Curl_easy *)0x0) {
    return CVar3;
  }
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)) &&
      (0 < Curl_trc_feat_read.log_level)))) {
    Curl_trc_read(data,"add fread reader, len=%ld -> %d",len,(ulong)CVar3);
  }
  return CVar3;
}

Assistant:

CURLcode Curl_creader_set_fread(struct Curl_easy *data, curl_off_t len)
{
  CURLcode result;
  struct Curl_creader *r;
  struct cr_in_ctx *ctx;

  result = Curl_creader_create(&r, data, &cr_in, CURL_CR_CLIENT);
  if(result)
    goto out;
  ctx = r->ctx;
  ctx->total_len = len;

  cl_reset_reader(data);
  result = do_init_reader_stack(data, r);
out:
  CURL_TRC_READ(data, "add fread reader, len=%"FMT_OFF_T " -> %d",
                len, result);
  return result;
}